

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::OverlappingExtensionRangeTest_ExtensionRangeBefore_Test::
TestBody(OverlappingExtensionRangeTest_ExtensionRangeBefore_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *arena;
  DescriptorProto *parent;
  FileDescriptor *pFVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar;
  string local_268;
  AssertHelper local_248;
  Message local_240;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_;
  MockErrorCollector error_collector;
  DescriptorPool pool;
  string local_158;
  DescriptorProto *local_138;
  DescriptorProto *foo;
  undefined1 local_120 [8];
  FileDescriptorProto foo_file;
  OverlappingExtensionRangeTest_ExtensionRangeBefore_Test *this_local;
  
  foo_file.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_120);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&foo_file.super_Message.super_MessageLite._internal_metadata_,0)
  ;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)local_120);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &foo_file.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
             "foo.proto",arena);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Foo",
             (allocator<char> *)
             ((long)&pool.feature_set_defaults_spec_._M_t.
                     super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false> + 7));
  parent = AddMessage((FileDescriptorProto *)local_120,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pool.feature_set_defaults_spec_._M_t.
                     super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false> + 7));
  local_138 = parent;
  AddExtensionRange(parent,10,0x14);
  AddExtensionRange(local_138,5,0xf);
  DescriptorPool::DescriptorPool
            ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8));
  MockErrorCollector::MockErrorCollector((MockErrorCollector *)&gtest_ar_.message_);
  pFVar3 = DescriptorPool::BuildFileCollectingErrors
                     ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8),
                      (FileDescriptorProto *)local_120,(ErrorCollector *)&gtest_ar_.message_);
  local_231 = pFVar3 == (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,&local_231,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_268,(internal *)local_230,
               (AssertionResult *)
               "pool.BuildFileCollectingErrors(foo_file, &error_collector) == nullptr","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x9eb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    testing::Message::~Message(&local_240);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::internal::EqHelper::
    Compare<char[95],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_280,
               "\"foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with \" \"already-defined range 10 to 19.\\n\""
               ,"error_collector.text_",
               (char (*) [95])
               "foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with already-defined range 10 to 19.\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &error_collector);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x9ef,pcVar4);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message(&local_288);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  MockErrorCollector::~MockErrorCollector((MockErrorCollector *)&gtest_ar_.message_);
  DescriptorPool::~DescriptorPool
            ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_120);
  return;
}

Assistant:

TEST(OverlappingExtensionRangeTest, ExtensionRangeBefore) {
  // Build descriptors for the following definitions:
  //
  //   message Foo {
  //     extensions 10 to 19;
  //     extensions 5 to 14;
  //   }
  FileDescriptorProto foo_file;
  foo_file.set_name("foo.proto");

  DescriptorProto* foo = AddMessage(&foo_file, "Foo");
  AddExtensionRange(foo, 10, 20);
  AddExtensionRange(foo, 5, 15);

  DescriptorPool pool;
  MockErrorCollector error_collector;
  // The extensions ranges are invalid, so the proto shouldn't build.
  ASSERT_TRUE(pool.BuildFileCollectingErrors(foo_file, &error_collector) ==
              nullptr);
  ASSERT_EQ(
      "foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with "
      "already-defined range 10 to 19.\n",
      error_collector.text_);
}